

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
DoShareTypeHandler(SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>
                   *this,ScriptContext *scriptContext)

{
  JavascriptString *propertyKey;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptString **ppJVar4;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  int index;
  
  if (((this->super_DynamicTypeHandler).flags & 0x1c) != 0xc) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xc05,
                                "((GetFlags() & (IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag)) == (IsLockedFlag | MayBecomeSharedFlag))"
                                ,
                                "(GetFlags() & (IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag)) == (IsLockedFlag | MayBecomeSharedFlag)"
                               );
    if (!bVar2) goto LAB_00de4d9b;
    *puVar3 = 0;
  }
  bVar2 = DynamicTypeHandler::ShouldFixAnyProperties();
  if ((!bVar2) && ((this->singletonInstance).ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0)
     ) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xc06,"(HasSingletonInstanceOnlyIfNeeded())",
                                "HasSingletonInstanceOnlyIfNeeded()");
    if (!bVar2) {
LAB_00de4d9b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = (this->propertyMap).ptr;
  if (0 < this_00->count - this_00->freeCount) {
    index = 0;
    do {
      ppJVar4 = JsUtil::
                BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                ::GetKeyAt(this_00,index);
      propertyKey = *ppJVar4;
      descriptor = JsUtil::
                   BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt((this->propertyMap).ptr,index);
      *(byte *)descriptor = *(byte *)descriptor | 2;
      SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
      InvalidateFixedField<Js::JavascriptString*>
                ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *)this,
                 propertyKey,descriptor,scriptContext);
      index = index + 1;
      this_00 = (this->propertyMap).ptr;
    } while (index < this_00->count - this_00->freeCount);
  }
  (this->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DoShareTypeHandler(ScriptContext* scriptContext)
    {
        Assert((GetFlags() & (IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag)) == (IsLockedFlag | MayBecomeSharedFlag));
        Assert(HasSingletonInstanceOnlyIfNeeded());

        // If this handler is becoming shared we need to remove the singleton instance (so that it can be collected
        // if no longer referenced by anything else) and invalidate any fixed fields.

        // The propertyMap dictionary is guaranteed to have contiguous entries because we never remove entries from it.
        for (int index = 0; index < propertyMap->Count(); index++)
        {
            TMapKey propertyKey = propertyMap->GetKeyAt(index);
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* const descriptor = propertyMap->GetReferenceAt(index);
            descriptor->isInitialized = true;
            InvalidateFixedField(propertyKey, descriptor, scriptContext);
        }

        this->singletonInstance = nullptr;
    }